

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_schema.c
# Opt level: O2

reflection_Type_ref_t export_type(flatcc_builder_t *B,fb_value_t type)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  reflection_Type_ref_t rVar6;
  int32_t v2;
  int32_t iVar7;
  char cVar8;
  reflection_BaseType_enum_t v1;
  reflection_BaseType_enum_t v0;
  reflection_BaseType_enum_t rVar9;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  v2 = -1;
  bVar5 = true;
  switch(type.field_0.s.len._0_2_) {
  case 8:
LAB_00115aa6:
    v0 = '\x0e';
    bVar3 = true;
    bVar5 = false;
    goto LAB_00115aee;
  case 9:
LAB_00115ae9:
    bVar3 = false;
    bVar5 = true;
    v0 = '\0';
LAB_00115aee:
    bVar4 = false;
    cVar8 = '\0';
    type.field_0._12_2_ = 0;
    goto LAB_00115c21;
  case 10:
    cVar8 = '\r';
    goto LAB_00115bbd;
  case 0xb:
    v0 = '\r';
    cVar8 = '\0';
    bVar3 = false;
    iVar7 = v2;
    goto LAB_00115bc3;
  default:
switchD_00115aa0_caseD_c:
    cVar8 = '\0';
    type.field_0._12_2_ = 0;
    v0 = '\0';
    bVar4 = false;
    bVar3 = false;
    iVar7 = v2;
    break;
  case 0xf:
    lVar2 = CONCAT44(in_stack_0000000c,in_stack_00000008);
    iVar7 = *(int32_t *)(lVar2 + 0xd0);
    uVar1 = *(ushort *)(lVar2 + 0x10);
    if (uVar1 < 2) {
      v0 = '\x0f';
    }
    else {
      if (uVar1 != 4) {
        if (uVar1 != 3) goto switchD_00115aa0_caseD_c;
        in_stack_00000008 = *(undefined4 *)(lVar2 + 0x50);
        v2 = iVar7;
        goto LAB_00115ae9;
      }
      v0 = '\x10';
    }
    type.field_0._12_2_ = 0;
    cVar8 = '\0';
    bVar4 = false;
    bVar3 = false;
    bVar5 = false;
    break;
  case 0x10:
    lVar2 = CONCAT44(in_stack_0000000c,in_stack_00000008);
    v2 = *(int32_t *)(lVar2 + 0xd0);
    uVar1 = *(ushort *)(lVar2 + 0x10);
    if (uVar1 < 2) {
      cVar8 = '\x0f';
    }
    else {
      if (uVar1 != 4) {
        if (uVar1 != 3) goto switchD_00115aa0_caseD_c;
        in_stack_00000008 = *(undefined4 *)(lVar2 + 0x50);
        goto LAB_00115aa6;
      }
      cVar8 = '\x10';
    }
LAB_00115bbd:
    bVar3 = true;
    v0 = '\x0e';
    iVar7 = v2;
LAB_00115bc3:
    bVar4 = false;
    type.field_0._12_2_ = 0;
    bVar5 = false;
    break;
  case 0x11:
    v0 = '\x11';
    bVar4 = true;
    bVar5 = false;
    bVar3 = false;
    cVar8 = '\0';
    goto LAB_00115c21;
  case 0x14:
    lVar2 = CONCAT44(in_stack_0000000c,in_stack_00000008);
    uVar1 = *(ushort *)(lVar2 + 0x10);
    in_stack_00000008 = 0;
    if (uVar1 < 2) {
      cVar8 = '\x0f';
    }
    else if (uVar1 == 4) {
      cVar8 = '\x10';
    }
    else {
      cVar8 = '\0';
      if (uVar1 == 3) {
        in_stack_00000008 = *(undefined4 *)(lVar2 + 0x50);
        cVar8 = '\0';
      }
    }
    v2 = *(int32_t *)(lVar2 + 0xd0);
    v0 = '\x11';
    bVar4 = true;
    bVar5 = false;
    bVar3 = false;
LAB_00115c21:
    iVar7 = v2;
    switch(in_stack_00000008) {
    case 1:
      rVar9 = '\n';
      break;
    case 2:
      rVar9 = '\b';
      break;
    case 3:
      rVar9 = '\x06';
      break;
    case 4:
      rVar9 = '\x04';
      break;
    case 5:
      rVar9 = '\x02';
      break;
    case 6:
      rVar9 = '\t';
      break;
    case 7:
      rVar9 = '\a';
      break;
    case 8:
      rVar9 = '\x05';
      break;
    case 9:
    case 0xc:
      rVar9 = '\x03';
      break;
    case 10:
      rVar9 = '\f';
      break;
    case 0xb:
      rVar9 = '\v';
      break;
    default:
      goto switchD_00115c38_default;
    }
    goto LAB_00115bc8;
  }
switchD_00115c38_default:
  rVar9 = '\0';
  v2 = iVar7;
LAB_00115bc8:
  v1 = cVar8;
  if (bVar3) {
    v1 = rVar9;
  }
  if (bVar4) {
    v1 = rVar9;
  }
  if (cVar8 != '\0') {
    v1 = cVar8;
  }
  if (bVar5) {
    v1 = cVar8;
    v0 = rVar9;
  }
  rVar6 = reflection_Type_create(B,v0,v1,v2,type.field_0._12_2_);
  return rVar6;
}

Assistant:

static reflection_Type_ref_t export_type(flatcc_builder_t *B, fb_value_t type)
{
    fb_scalar_type_t st = fb_missing_type;
    int32_t index = -1;
    reflection_BaseType_enum_t base_type = BaseType(None);
    reflection_BaseType_enum_t element = BaseType(None);
    reflection_BaseType_enum_t primitive = BaseType(None);
    uint16_t fixed_length = 0;

    switch (type.type) {
    case vt_scalar_type:
        st = type.st;
        break;
    case vt_vector_type:
        st = type.st;
        base_type = BaseType(Vector);
        break;
    case vt_vector_string_type:
        element = BaseType(String);
        base_type = BaseType(Vector);
        break;
    case vt_vector_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            base_type = BaseType(Vector);
            break;
        case fb_is_struct:
        case fb_is_table:
            base_type = BaseType(Vector);
            element = BaseType(Obj);
            break;
        case fb_is_union:
            base_type = BaseType(Vector);
            element = BaseType(Union);
            break;
        default:
            break;
        }
        break;
    case vt_string_type:
        base_type = BaseType(String);
        break;
    case vt_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            break;
        case fb_is_struct:
        case fb_is_table:
            base_type = BaseType(Obj);
            break;
        case fb_is_union:
            base_type = BaseType(Union);
            break;
        default:
            index = -1;
            break;
        }
        break;
    case vt_fixed_array_type:
        st = type.st;
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    case vt_fixed_array_string_type:
        break;
        element = BaseType(Byte);
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    case vt_fixed_array_compound_type_ref:
        index = (int32_t)type.ct->export_index;
        switch (type.ct->symbol.kind) {
        case fb_is_enum:
            st = type.ct->type.st;
            break;
        case fb_is_struct:
        case fb_is_table:
            element = BaseType(Obj);
            break;
        case fb_is_union:
            element = BaseType(Union);
            break;
        default:
            break;
        }
        base_type = BaseType(Array);
        fixed_length = (uint16_t)type.len;
        break;
    default:
        break;
    }
    /* If st is set, resolve scalar type and set it to base_type or element. */
    switch (st) {
    case fb_missing_type: break;
    case fb_ulong: primitive = BaseType(ULong); break;
    case fb_uint: primitive = BaseType(UInt); break;
    case fb_ushort: primitive = BaseType(UShort); break;
    case fb_ubyte: primitive = BaseType(UByte); break;
    case fb_bool: primitive = BaseType(Bool); break;
    case fb_long: primitive = BaseType(Long); break;
    case fb_int: primitive = BaseType(Int); break;
    case fb_short: primitive = BaseType(Short); break;
    case fb_byte: primitive = BaseType(Byte); break;
    case fb_double: primitive = BaseType(Double); break;
    case fb_float: primitive = BaseType(Float); break;
    /* TODO: Googles flatc tool does not have char arrays so we use Byte as element type */
    case fb_char: primitive = BaseType(Byte); break;
    default: break;
    }

    if (base_type == BaseType(None)) {
        base_type = primitive;
    } else if (base_type == BaseType(Vector) || base_type == BaseType(Array)) {
        if (element == BaseType(None)) {
            element = primitive;
        }
    }
    return reflection_Type_create(B, base_type, element, index, fixed_length);
}